

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O3

double __thiscall soinn::ESOINN::maxDensity(ESOINN *this,int classId)

{
  double dVar1;
  _List_node_base *p_Var2;
  double dVar3;
  
  dVar3 = 2.2250738585072014e-308;
  for (p_Var2 = (this->graph).super_type.m_vertices.
                super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
                super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&(this->graph).super_type.m_vertices; p_Var2 = p_Var2->_M_next) {
    dVar1 = (double)p_Var2[1]._M_next[4]._M_next;
    if ((dVar3 < dVar1) && (*(int *)((long)(p_Var2[1]._M_next + 3) + 8) == classId)) {
      dVar3 = dVar1;
    }
  }
  return dVar3;
}

Assistant:

double ESOINN::maxDensity(int classId)
{
    double density = std::numeric_limits<double>::min();
    VertexIterator current, end;
    boost::tie(current, end) = boost::vertices(graph);
    for(; current != end; current++)
    {
        if(graph[*current].density > density && graph[*current].classId == classId)
        {
            density = graph[*current].density;
        }
    }
    return density;
}